

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

void mjs::gc_type_info_registration<mjs::gc_function>::destroy(void *p)

{
  (*(code *)**(undefined8 **)((long)p + 8))((long)p + 8);
  return;
}

Assistant:

static void destroy(void* p) {
        // We're fine with mjs::object having a non-virtual destructor
        // Derived classes are properly destructed by their own type info classes
#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wdelete-non-virtual-dtor"
#endif
        static_cast<T*>(p)->~T();
#ifdef __clang__
#pragma clang diagnostic pop
#endif
    }